

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 __thiscall lrit::File::getData(File *this)

{
  bool bVar1;
  ulong uVar2;
  runtime_error *this_00;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> in_RDI;
  File *in_stack_00000118;
  File *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    getDataFromFile(in_stack_00000118);
  }
  else {
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI._M_head_impl)
    ;
    if (bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      util::str_abi_cxx11_((char *)in_stack_ffffffffffffffc8);
      std::runtime_error::runtime_error(this_00,local_30);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    getDataFromBuffer(in_stack_ffffffffffffffc8);
  }
  return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
          )(tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
            )in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<std::istream> File::getData() const {
  if (!file_.empty()) {
    return getDataFromFile();
  }
  if (!buf_.empty()) {
    return getDataFromBuffer();
  }
  ERROR("unreachable");
}